

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::createAndUploadTexture
          (TextureGather2DCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  TextureFormat TVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture2D *this_01;
  long *plVar4;
  pointer pPVar5;
  Texture2D *pTVar6;
  size_type *psVar7;
  ConstPixelBufferAccess *access;
  pointer pPVar8;
  int iVar9;
  void *__buf;
  long lVar10;
  long lVar11;
  long lVar12;
  TextureFormatInfo texFmtInfo;
  string local_480;
  string local_460;
  long local_440;
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  LogImage local_3f8;
  TextureFormatInfo local_368;
  undefined8 local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  context = ((this->super_TextureGatherCase).super_TestCase.m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar11 = CONCAT44(extraout_var,iVar2);
  tcu::getTextureFormatInfo(&local_368,&(this->super_TextureGatherCase).m_textureFormat);
  this_01 = (Texture2D *)operator_new(0x70);
  dVar3 = glu::getInternalFormat((this->super_TextureGatherCase).m_textureFormat);
  glu::Texture2D::Texture2D
            (this_01,context,dVar3,(this->m_textureSize).m_data[0],(this->m_textureSize).m_data[1]);
  pTVar6 = (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
           m_data.ptr;
  local_440 = lVar11;
  if (pTVar6 != this_01) {
    if (pTVar6 != (Texture2D *)0x0) {
      (*pTVar6->_vptr_Texture2D[1])();
    }
    (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr = this_01;
    pTVar6 = this_01;
  }
  iVar2 = (this->super_TextureGatherCase).m_baseLevel;
  if (((this->super_TextureGatherCase).m_minFilter - NEAREST_MIPMAP_NEAREST < 4) &&
     (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    iVar9 = (int)((ulong)((long)(pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  }
  else {
    iVar9 = iVar2 + 1;
  }
  if (iVar2 < iVar9) {
    lVar11 = (long)iVar2 * 0x28;
    do {
      tcu::Texture2D::allocLevel(&pTVar6->m_refTexture,iVar2);
      pPVar5 = (pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      access = (ConstPixelBufferAccess *)
               ((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data + lVar11 + -8);
      dVar3 = tcu::CommandLine::getBaseSeed
                        (((this->super_TextureGatherCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_cmdLine);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)access,&local_368.valueMin,&local_368.valueMax,dVar3);
      TVar1 = (TextureFormat)
              ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_418,0,(char *)0x0,0x1c8945e);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_460.field_2._M_allocated_capacity = *psVar7;
        local_460.field_2._8_8_ = plVar4[3];
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar7;
        local_460._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_460._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,0x1c89470);
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_480.field_2._M_allocated_capacity = *psVar7;
        local_480.field_2._8_8_ = plVar4[3];
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar7;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::LogImage::LogImage
                (&local_3f8,&local_460,&local_480,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_3f8,TVar1.order,__buf,(size_t)access);
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = TVar1;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_328[0] = *(undefined8 *)
                      ((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data + lVar11);
      tcu::operator<<((ostream *)this_00,(Vector<int,_2> *)local_328);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_description._M_dataplus._M_p != &local_3f8.m_description.field_2) {
        operator_delete(local_3f8.m_description._M_dataplus._M_p,
                        local_3f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
        operator_delete(local_3f8.m_name._M_dataplus._M_p,
                        local_3f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      if (local_418[0] != local_408) {
        operator_delete(local_418[0],local_408[0] + 1);
      }
      iVar2 = iVar2 + 1;
      lVar11 = lVar11 + 0x28;
    } while (iVar9 != iVar2);
  }
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_1b0,(TextureFormat *)&pTVar6->m_refTexture,
             (pTVar6->m_refTexture).m_width,(pTVar6->m_refTexture).m_height);
  tcu::Texture2D::operator=(&this->m_swizzledTexture,(Texture2D *)local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1b0);
  pPVar5 = (pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar8 = (pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar8 - (long)pPVar5) >> 3) * -0x33333333) {
    lVar11 = 8;
    lVar12 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&((pTVar6->m_refTexture).super_TextureLevelPyramid.m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11) != 0) {
        tcu::Texture2D::allocLevel(&this->m_swizzledTexture,(int)lVar10);
        swizzlePixels((PixelBufferAccess *)
                      ((long)(((this->m_swizzledTexture).super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar12 + -8),
                      (ConstPixelBufferAccess *)
                      ((long)(((pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar12 + -8),
                      &(this->super_TextureGatherCase).m_textureSwizzle);
        pPVar5 = (pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar8 = (pTVar6->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x28;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)pPVar8 - (long)pPVar5) >> 3) * -0x33333333);
  }
  (**(code **)(local_440 + 8))(0x84c0);
  (*((this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr)->_vptr_Texture2D[2])();
  return;
}

Assistant:

void TextureGather2DCase::createAndUploadTexture (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::Texture2D>(new glu::Texture2D(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize.x(), m_textureSize.y()));

	{
		tcu::Texture2D&		refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			refTexture.allocLevel(levelNdx);
			const PixelBufferAccess& level = refTexture.getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed());
			m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
							   << TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}